

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall duckdb_re2::Compiler::ByteRange(Compiler *this,int lo,int hi,bool foldcase)

{
  uint32_t begin;
  PatchList end;
  undefined8 in_RDI;
  Frag FVar1;
  int id;
  int in_stack_ffffffffffffffac;
  uint32_t in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Inst *in_stack_ffffffffffffffc0;
  uint32_t local_30;
  bool bStack_2c;
  uint32_t local_10;
  uint32_t in_stack_fffffffffffffff4;
  uint32_t in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  begin = AllocInst((Compiler *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    in_stack_fffffffffffffff4);
  if ((int)begin < 0) {
    FVar1 = NoMatch((Compiler *)0x814dd2);
    local_10 = FVar1.begin;
    in_stack_fffffffffffffff4 = FVar1.end.head;
    local_30 = FVar1.end.tail;
    bStack_2c = FVar1.nullable;
    in_stack_fffffffffffffffc._0_1_ = bStack_2c;
  }
  else {
    PODArray<duckdb_re2::Prog::Inst>::operator[]
              ((PODArray<duckdb_re2::Prog::Inst> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
    Prog::Inst::InitByteRange
              (in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
               in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    end = PatchList::Mk(begin << 1);
    Frag::Frag((Frag *)&local_10,begin,end,false);
    local_30 = in_stack_fffffffffffffff8;
  }
  FVar1.end.head = in_stack_fffffffffffffff4;
  FVar1.begin = local_10;
  FVar1.end.tail = local_30;
  FVar1.nullable = SUB41(in_stack_fffffffffffffffc,0);
  FVar1._13_3_ = SUB43(in_stack_fffffffffffffffc,1);
  return FVar1;
}

Assistant:

Frag Compiler::ByteRange(int lo, int hi, bool foldcase) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitByteRange(lo, hi, foldcase, 0);
  return Frag(id, PatchList::Mk(id << 1), false);
}